

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswClass.c
# Opt level: O1

Ssw_Cla_t *
Ssw_ClassesPrepare(Aig_Man_t *pAig,int nFramesK,int fLatchCorr,int fConstCorr,int fOutputCorr,
                  int nMaxLevs,int fVerbose)

{
  byte *pbVar1;
  uint uVar2;
  int *piVar3;
  ulong uVar4;
  void *pvVar5;
  int iVar6;
  int iVar7;
  Ssw_Cla_t *pSVar8;
  Vec_Ptr_t *vCands;
  void **ppvVar9;
  Aig_Obj_t **ppAVar10;
  Vec_Ptr_t *pVVar11;
  Aig_Obj_t *pAVar12;
  long lVar13;
  long lVar14;
  ulong uVar15;
  uint uVar16;
  Aig_Man_t *pAVar17;
  Ssw_Cla_t *pSVar18;
  undefined1 auVar19 [16];
  timespec ts;
  timespec local_78;
  uint local_64;
  long local_60;
  int local_54;
  Ssw_Cla_t *local_50;
  Ssw_Sml_t *local_48;
  int local_3c;
  long local_38;
  
  local_60 = CONCAT44(local_60._4_4_,fLatchCorr);
  local_64 = 4;
  if (4 < nFramesK) {
    local_64 = nFramesK;
  }
  local_3c = fOutputCorr;
  pSVar8 = Ssw_ClassesStart(pAig);
  pSVar8->fConstCorr = fConstCorr;
  local_54 = fConstCorr;
  iVar6 = clock_gettime(3,&local_78);
  if (iVar6 < 0) {
    lVar14 = 1;
  }
  else {
    lVar14 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_78.tv_nsec),8);
    lVar14 = ((lVar14 >> 7) - (lVar14 >> 0x3f)) + local_78.tv_sec * -1000000;
  }
  pAVar17 = pAig;
  local_48 = Ssw_SmlSimulateSeq(pAig,0,local_64,2);
  uVar16 = local_64;
  iVar6 = (int)pAVar17;
  if (fVerbose != 0) {
    lVar13 = (ulong)local_64 * (long)pAig->vObjs->nSize * 8;
    auVar19._8_4_ = (int)((ulong)lVar13 >> 0x20);
    auVar19._0_8_ = lVar13;
    auVar19._12_4_ = 0x45300000;
    Abc_Print(iVar6,"Allocated %.2f MB to store simulation information.\n",
              ((auVar19._8_8_ - 1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,(int)lVar13) - 4503599627370496.0)) * 9.5367431640625e-07
             );
    Abc_Print(iVar6,"Initial simulation of %d frames with %d words.     ",(ulong)uVar16,2);
    Abc_Print(iVar6,"%s =","Time");
    iVar7 = 3;
    iVar6 = clock_gettime(3,&local_78);
    if (iVar6 < 0) {
      lVar13 = -1;
    }
    else {
      lVar13 = local_78.tv_nsec / 1000 + local_78.tv_sec * 1000000;
    }
    Abc_Print(iVar7,"%9.2f sec\n",(double)(lVar13 + lVar14) / 1000000.0);
  }
  iVar6 = clock_gettime(3,&local_78);
  if (iVar6 < 0) {
    local_38 = 1;
  }
  else {
    lVar14 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_78.tv_nsec),8);
    local_38 = ((lVar14 >> 7) - (lVar14 >> 0x3f)) + local_78.tv_sec * -1000000;
  }
  pSVar8->pManData = local_48;
  pSVar8->pFuncNodeHash = Ssw_SmlObjHashWord;
  pSVar8->pFuncNodeIsConst = Ssw_SmlObjIsConstWord;
  pSVar8->pFuncNodesAreEqual = Ssw_SmlObjsAreEqualWord;
  vCands = (Vec_Ptr_t *)malloc(0x10);
  vCands->nCap = 1000;
  vCands->nSize = 0;
  ppvVar9 = (void **)malloc(8000);
  vCands->pArray = ppvVar9;
  pAVar17 = pSVar8->pAig;
  pVVar11 = pAVar17->vObjs;
  local_50 = pSVar8;
  if (0 < pVVar11->nSize) {
    lVar14 = 0;
    iVar6 = (int)local_60;
    do {
      piVar3 = (int *)pVVar11->pArray[lVar14];
      if (piVar3 != (int *)0x0) {
        uVar16 = (uint)*(undefined8 *)(piVar3 + 6);
        if (iVar6 == 0) {
          uVar16 = uVar16 & 7;
          if (((uVar16 == 2) || (uVar16 - 5 < 2)) &&
             ((nMaxLevs == 0 ||
              ((int)((uint)((ulong)*(undefined8 *)(piVar3 + 6) >> 0x20) & 0xffffff) <= nMaxLevs))))
          goto LAB_005dc559;
        }
        else if (((uVar16 & 7) == 2) && (pAVar17->nTruePis <= *piVar3)) {
LAB_005dc559:
          uVar16 = vCands->nSize;
          uVar2 = vCands->nCap;
          if (uVar16 == uVar2) {
            if ((int)uVar2 < 0x10) {
              if (vCands->pArray == (void **)0x0) {
                ppvVar9 = (void **)malloc(0x80);
              }
              else {
                ppvVar9 = (void **)realloc(vCands->pArray,0x80);
              }
              iVar7 = 0x10;
            }
            else {
              iVar7 = uVar2 * 2;
              if (iVar7 <= (int)uVar2) goto LAB_005dc5c7;
              if (vCands->pArray == (void **)0x0) {
                ppvVar9 = (void **)malloc((ulong)uVar2 << 4);
              }
              else {
                ppvVar9 = (void **)realloc(vCands->pArray,(ulong)uVar2 << 4);
              }
            }
            vCands->pArray = ppvVar9;
            vCands->nCap = iVar7;
            iVar6 = (int)local_60;
          }
LAB_005dc5c7:
          vCands->nSize = uVar16 + 1;
          vCands->pArray[(int)uVar16] = piVar3;
        }
      }
      lVar14 = lVar14 + 1;
      pVVar11 = pAVar17->vObjs;
    } while (lVar14 < pVVar11->nSize);
  }
  if (local_3c != 0) {
    vCands->nSize = 0;
    pVVar11 = pAVar17->vObjs;
    if (0 < pVVar11->nSize) {
      lVar14 = 0;
      do {
        if (pVVar11->pArray[lVar14] != (void *)0x0) {
          pbVar1 = (byte *)((long)pVVar11->pArray[lVar14] + 0x18);
          *pbVar1 = *pbVar1 & 0xdf;
        }
        lVar14 = lVar14 + 1;
        pVVar11 = pAVar17->vObjs;
      } while (lVar14 < pVVar11->nSize);
    }
    if (0 < pAVar17->nTruePos) {
      lVar14 = 0;
      do {
        if (pAVar17->vCos->nSize <= lVar14) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                        ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
        }
        uVar15 = *(ulong *)((long)pAVar17->vCos->pArray[lVar14] + 8) & 0xfffffffffffffffe;
        uVar4 = *(ulong *)(uVar15 + 0x18);
        uVar16 = (uint)uVar4 & 7;
        if ((uVar16 < 7) && ((100U >> uVar16 & 1) != 0)) {
          *(ulong *)(uVar15 + 0x18) = uVar4 | 0x20;
        }
        lVar14 = lVar14 + 1;
      } while (lVar14 < pAVar17->nTruePos);
    }
    pVVar11 = pAVar17->vObjs;
    if (0 < pVVar11->nSize) {
      lVar14 = 0;
      do {
        pvVar5 = pVVar11->pArray[lVar14];
        if ((pvVar5 != (void *)0x0) && ((*(byte *)((long)pvVar5 + 0x18) & 0x20) != 0)) {
          uVar16 = vCands->nSize;
          uVar2 = vCands->nCap;
          if (uVar16 == uVar2) {
            if ((int)uVar2 < 0x10) {
              if (vCands->pArray == (void **)0x0) {
                ppvVar9 = (void **)malloc(0x80);
              }
              else {
                ppvVar9 = (void **)realloc(vCands->pArray,0x80);
              }
              iVar6 = 0x10;
            }
            else {
              iVar6 = uVar2 * 2;
              if (iVar6 <= (int)uVar2) goto LAB_005dc71d;
              if (vCands->pArray == (void **)0x0) {
                ppvVar9 = (void **)malloc((ulong)uVar2 << 4);
              }
              else {
                ppvVar9 = (void **)realloc(vCands->pArray,(ulong)uVar2 << 4);
              }
            }
            vCands->pArray = ppvVar9;
            vCands->nCap = iVar6;
          }
LAB_005dc71d:
          vCands->nSize = uVar16 + 1;
          vCands->pArray[(int)uVar16] = pvVar5;
        }
        lVar14 = lVar14 + 1;
        pVVar11 = pAVar17->vObjs;
      } while (lVar14 < pVVar11->nSize);
    }
    pVVar11 = pAVar17->vObjs;
    if (0 < pVVar11->nSize) {
      lVar14 = 0;
      do {
        if (pVVar11->pArray[lVar14] != (void *)0x0) {
          pbVar1 = (byte *)((long)pVVar11->pArray[lVar14] + 0x18);
          *pbVar1 = *pbVar1 & 0xdf;
        }
        lVar14 = lVar14 + 1;
        pVVar11 = pAVar17->vObjs;
      } while (lVar14 < pVVar11->nSize);
    }
  }
  pSVar8 = local_50;
  ppAVar10 = (Aig_Obj_t **)malloc((long)vCands->nSize << 3);
  pSVar8->pMemClasses = ppAVar10;
  pSVar8->pMemClassesFree = ppAVar10;
  pSVar18 = pSVar8;
  Ssw_ClassesPrepareRehash(pSVar8,vCands,local_54);
  iVar6 = (int)pSVar18;
  if (fVerbose != 0) {
    Abc_Print(iVar6,"Collecting candidate equivalence classes.        ");
    Abc_Print(iVar6,"%s =","Time");
    iVar7 = 3;
    iVar6 = clock_gettime(3,&local_78);
    if (iVar6 < 0) {
      lVar14 = -1;
    }
    else {
      lVar14 = local_78.tv_nsec / 1000 + local_78.tv_sec * 1000000;
    }
    Abc_Print(iVar7,"%9.2f sec\n",(double)(lVar14 + local_38) / 1000000.0);
  }
  iVar6 = clock_gettime(3,&local_78);
  if (iVar6 < 0) {
    local_60 = 1;
  }
  else {
    lVar14 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_78.tv_nsec),8);
    local_60 = ((lVar14 >> 7) - (lVar14 >> 0x3f)) + local_78.tv_sec * -1000000;
  }
  iVar6 = 1;
  do {
    vCands->nSize = 0;
    pAVar17 = pSVar8->pAig;
    pVVar11 = pAVar17->vObjs;
    uVar16 = 0;
    if (0 < pVVar11->nSize) {
      lVar14 = 0;
      uVar16 = 0;
      do {
        pvVar5 = pVVar11->pArray[lVar14];
        if (pvVar5 != (void *)0x0) {
          if (pAVar17->pReprs == (Aig_Obj_t **)0x0) {
            pAVar12 = (Aig_Obj_t *)0x0;
          }
          else {
            pAVar12 = pAVar17->pReprs[*(int *)((long)pvVar5 + 0x24)];
          }
          if (pAVar12 == pAVar17->pConst1) {
            uVar2 = vCands->nCap;
            if (uVar16 == uVar2) {
              if ((int)uVar2 < 0x10) {
                if (vCands->pArray == (void **)0x0) {
                  ppvVar9 = (void **)malloc(0x80);
                }
                else {
                  ppvVar9 = (void **)realloc(vCands->pArray,0x80);
                }
                iVar7 = 0x10;
              }
              else {
                iVar7 = uVar2 * 2;
                if (iVar7 <= (int)uVar2) goto LAB_005dc947;
                if (vCands->pArray == (void **)0x0) {
                  ppvVar9 = (void **)malloc((ulong)uVar2 << 4);
                }
                else {
                  ppvVar9 = (void **)realloc(vCands->pArray,(ulong)uVar2 << 4);
                }
              }
              vCands->pArray = ppvVar9;
              vCands->nCap = iVar7;
            }
LAB_005dc947:
            lVar13 = (long)(int)uVar16;
            uVar16 = uVar16 + 1;
            vCands->nSize = uVar16;
            vCands->pArray[lVar13] = pvVar5;
          }
        }
        lVar14 = lVar14 + 1;
        pVVar11 = pAVar17->vObjs;
      } while (lVar14 < pVVar11->nSize);
    }
    pSVar8 = local_50;
    if (uVar16 != local_50->nCands1) {
      __assert_fail("Vec_PtrSize(vCands) == p->nCands1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/ssw/sswClass.c"
                    ,0x2b4,
                    "Ssw_Cla_t *Ssw_ClassesPrepare(Aig_Man_t *, int, int, int, int, int, int)");
    }
    Ssw_SmlResimulateSeq(local_48);
    iVar7 = Ssw_ClassesPrepareRehash(pSVar8,vCands,local_54);
    if (iVar7 == 0) goto LAB_005dc9bf;
    iVar6 = iVar6 + 1;
  } while (iVar6 != 0x10);
  iVar6 = 0x10;
LAB_005dc9bf:
  Ssw_SmlStop(local_48);
  if (vCands->pArray != (void **)0x0) {
    free(vCands->pArray);
    vCands->pArray = (void **)0x0;
  }
  free(vCands);
  iVar7 = (int)vCands;
  if (fVerbose != 0) {
    Abc_Print(iVar7,"Simulation of %d frames with %d words (%2d rounds). ",(ulong)local_64,2,
              (ulong)(iVar6 - 1));
    Abc_Print(iVar7,"%s =","Time");
    iVar7 = 3;
    iVar6 = clock_gettime(3,&local_78);
    if (iVar6 < 0) {
      lVar14 = -1;
    }
    else {
      lVar14 = local_78.tv_nsec / 1000 + local_78.tv_sec * 1000000;
    }
    Abc_Print(iVar7,"%9.2f sec\n",(double)(lVar14 + local_60) / 1000000.0);
  }
  Ssw_ClassesCheck(pSVar8);
  return pSVar8;
}

Assistant:

Ssw_Cla_t * Ssw_ClassesPrepare( Aig_Man_t * pAig, int nFramesK, int fLatchCorr, int fConstCorr, int fOutputCorr, int nMaxLevs, int fVerbose )
{
//    int nFrames =  4;
//    int nWords  =  1;
//    int nIters  = 16;

//    int nFrames = 32;
//    int nWords  =  4;
//    int nIters  =  0;

    int nFrames =  Abc_MaxInt( nFramesK, 4 );
    int nWords  =  2;
    int nIters  = 16;
    Ssw_Cla_t * p;
    Ssw_Sml_t * pSml;
    Vec_Ptr_t * vCands;
    Aig_Obj_t * pObj;
    int i, k, RetValue;
    abctime clk;

    // start the classes
    p = Ssw_ClassesStart( pAig );
    p->fConstCorr = fConstCorr;

    // perform sequential simulation
clk = Abc_Clock();
    pSml = Ssw_SmlSimulateSeq( pAig, 0, nFrames, nWords );
if ( fVerbose )
{
    Abc_Print( 1, "Allocated %.2f MB to store simulation information.\n",
        1.0*(sizeof(unsigned) * Aig_ManObjNumMax(pAig) * nFrames * nWords)/(1<<20) );
    Abc_Print( 1, "Initial simulation of %d frames with %d words.     ", nFrames, nWords );
    ABC_PRT( "Time", Abc_Clock() - clk );
}

    // set comparison procedures
clk = Abc_Clock();
    Ssw_ClassesSetData( p, pSml, (unsigned(*)(void *,Aig_Obj_t *))Ssw_SmlObjHashWord, (int(*)(void *,Aig_Obj_t *))Ssw_SmlObjIsConstWord, (int(*)(void *,Aig_Obj_t *,Aig_Obj_t *))Ssw_SmlObjsAreEqualWord );

    // collect nodes to be considered as candidates
    vCands = Vec_PtrAlloc( 1000 );
    Aig_ManForEachObj( p->pAig, pObj, i )
    {
        if ( fLatchCorr )
        {
            if ( !Saig_ObjIsLo(p->pAig, pObj) )
                continue;
        }
        else
        {
            if ( !Aig_ObjIsNode(pObj) && !Aig_ObjIsCi(pObj) )
                continue;
            // skip the node with more that the given number of levels
            if ( nMaxLevs && (int)pObj->Level > nMaxLevs )
                continue;
        }
        Vec_PtrPush( vCands, pObj );
    }

    // this change will consider all PO drivers
    if ( fOutputCorr )
    {
        Vec_PtrClear( vCands );
        Aig_ManForEachObj( p->pAig, pObj, i )
            pObj->fMarkB = 0;
        Saig_ManForEachPo( p->pAig, pObj, i )
            if ( Aig_ObjIsCand(Aig_ObjFanin0(pObj)) )
                Aig_ObjFanin0(pObj)->fMarkB = 1;
        Aig_ManForEachObj( p->pAig, pObj, i )
            if ( pObj->fMarkB )
                Vec_PtrPush( vCands, pObj );
        Aig_ManForEachObj( p->pAig, pObj, i )
            pObj->fMarkB = 0;
    }

    // allocate room for classes
    p->pMemClasses = ABC_ALLOC( Aig_Obj_t *, Vec_PtrSize(vCands) );
    p->pMemClassesFree = p->pMemClasses;

    // now it is time to refine the classes
    Ssw_ClassesPrepareRehash( p, vCands, fConstCorr );
if ( fVerbose )
{
    Abc_Print( 1, "Collecting candidate equivalence classes.        " );
ABC_PRT( "Time", Abc_Clock() - clk );
}

clk = Abc_Clock();
    // perform iterative refinement using simulation
    for ( i = 1; i < nIters; i++ )
    {
        // collect const1 candidates
        Vec_PtrClear( vCands );
        Aig_ManForEachObj( p->pAig, pObj, k )
            if ( Ssw_ObjIsConst1Cand( p->pAig, pObj ) )
                Vec_PtrPush( vCands, pObj );
        assert( Vec_PtrSize(vCands) == p->nCands1 );
        // perform new round of simulation
        Ssw_SmlResimulateSeq( pSml );
        // check equivalence classes
        RetValue = Ssw_ClassesPrepareRehash( p, vCands, fConstCorr );
        if ( RetValue == 0 )
            break;
    }
    Ssw_SmlStop( pSml );
    Vec_PtrFree( vCands );
if ( fVerbose )
{
    Abc_Print( 1, "Simulation of %d frames with %d words (%2d rounds). ",
        nFrames, nWords, i-1 );
    ABC_PRT( "Time", Abc_Clock() - clk );
}
    Ssw_ClassesCheck( p );
//    Ssw_ClassesPrint( p, 0 );
    return p;
}